

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream-reader.hh
# Opt level: O2

ssize_t __thiscall
tinyusdz::StreamReader::read(StreamReader *this,int __fd,void *__buf,size_t __nbytes)

{
  uint64_t uVar1;
  size_t nbytes;
  size_t __n;
  undefined4 in_register_00000034;
  
  uVar1 = this->idx_;
  __n = this->length_ - uVar1;
  if (uVar1 + CONCAT44(in_register_00000034,__fd) <= this->length_) {
    __n = CONCAT44(in_register_00000034,__fd);
  }
  if ((void *)(__n - 1) < __buf) {
    memcpy((void *)__nbytes,this->binary_ + uVar1,__n);
    this->idx_ = this->idx_ + __n;
  }
  else {
    __n = 0;
  }
  return __n;
}

Assistant:

uint64_t read(const uint64_t n, const uint64_t dst_len, uint8_t *dst) const {
    uint64_t len = n;
    if ((idx_ + len) > length_) {
      len = length_ - uint64_t(idx_);
    }

    if (len > 0) {
      if (dst_len < len) {
        // dst does not have enough space. return 0 for a while.
        return 0;
      }

      size_t nbytes = size_t(len); // may shorten size on 32bit platform

      memcpy(dst, &binary_[idx_], nbytes);
      idx_ += nbytes;
      return nbytes;

    } else {
      return 0;
    }
  }